

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O0

int handle_smooth_inter_intra_mode
              (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,MB_MODE_INFO *mbmi,int64_t ref_best_rd,
              int *rate_mv,INTERINTRA_MODE *best_interintra_mode,int64_t *best_rd,
              int *best_mode_rate,BUFFER_SET *orig_dst,uint8_t *tmp_buf,uint8_t *intrapred,
              HandleInterModeArgs *args)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  INTERINTRA_MODE *best_interintra_mode_00;
  uint16_t *tmp_buf_00;
  tran_low_t *intrapred_00;
  int64_t iVar5;
  long lVar6;
  long in_RCX;
  BLOCK_SIZE in_DL;
  long in_RSI;
  long in_RDI;
  uint8_t *in_R8;
  int64_t *in_R9;
  byte *in_stack_00000008;
  long *in_stack_00000010;
  int *in_stack_00000018;
  int64_t in_stack_00000028;
  long in_stack_00000038;
  int64_t rd;
  int64_t rd_thresh;
  int total_mode_rate;
  int rmode;
  int is_wedge_used;
  RD_STATS rd_stats;
  _Bool interintra_mode_reuse;
  INTERINTRA_MODE cur_mode;
  int64_t best_interintra_rd;
  int bw;
  AV1_COMMON *cm;
  int *interintra_mode_cost;
  ModeCosts *mode_costs;
  MACROBLOCKD *xd;
  int64_t in_stack_ffffffffffffff00;
  byte *in_stack_ffffffffffffff08;
  int total_mode_rate_00;
  MACROBLOCK *in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  uint in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  BLOCK_SIZE bs;
  AV1_COMP *in_stack_ffffffffffffff38;
  uint8_t *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  BLOCK_SIZE bsize_00;
  MACROBLOCKD *in_stack_ffffffffffffff60;
  MACROBLOCK *in_stack_ffffffffffffff68;
  MACROBLOCKD *in_stack_ffffffffffffff70;
  MB_MODE_INFO *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff86;
  BLOCK_SIZE in_stack_ffffffffffffff87;
  MACROBLOCKD *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  int local_14;
  
  total_mode_rate_00 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  best_interintra_mode_00 = (INTERINTRA_MODE *)(in_RSI + 0x1a0);
  tmp_buf_00 = (uint16_t *)(in_RSI + 0x4230);
  intrapred_00 = (tran_low_t *)(in_RSI + 0x8968 + (ulong)""[in_DL] * 0x10);
  uVar1 = (uint)block_size_wide[in_DL];
  *(ushort *)(in_RCX + 0xa7) = *(ushort *)(in_RCX + 0xa7) & 0xfbff;
  if ((*(int *)(in_RDI + 0x60ab0) == 0) || (*in_stack_00000008 == 4)) {
    in_stack_ffffffffffffff88 = (MACROBLOCKD *)0x7fffffffffffffff;
    for (in_stack_ffffffffffffff87 = BLOCK_4X4;
        total_mode_rate_00 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
        in_stack_ffffffffffffff87 < BLOCK_8X16;
        in_stack_ffffffffffffff87 = in_stack_ffffffffffffff87 + BLOCK_4X8) {
      if ((((*(byte *)(in_RDI + 0x426e9) & 1) != 0) && (*(int *)(in_RDI + 0x60b90) == 0)) ||
         (in_stack_ffffffffffffff87 != BLOCK_8X8)) {
        in_stack_ffffffffffffff10 = (MACROBLOCK *)&stack0xffffffffffffff88;
        in_stack_ffffffffffffff18 = (uint)in_stack_ffffffffffffff87;
        in_stack_ffffffffffffff20 = (uint)in_DL;
        in_stack_ffffffffffffff00 = in_stack_00000028;
        in_stack_ffffffffffffff08 = in_stack_00000008;
        compute_best_interintra_mode
                  ((AV1_COMP *)
                   CONCAT17(in_stack_ffffffffffffff87,
                            CONCAT16(in_stack_ffffffffffffff86,
                                     CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)))
                   ,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                   &in_stack_ffffffffffffff60->mi_row,
                   (BUFFER_SET *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                   (uint8_t *)intrapred_00,(uint8_t *)tmp_buf_00,best_interintra_mode_00,in_R9,
                   (INTERINTRA_MODE)in_R8,(BLOCK_SIZE)in_RCX);
      }
    }
    *(byte *)(*(long *)(in_stack_00000038 + 0x88) + (long)*(char *)(in_RCX + 0x10)) =
         *in_stack_00000008;
  }
  bsize_00 = (BLOCK_SIZE)((uint)in_stack_ffffffffffffff5c >> 0x18);
  bs = true;
  if (*(int *)(in_RDI + 0x60ab0) == 0) {
    bs = *in_stack_00000008 != 4;
  }
  if (((bool)bs != false) || (*in_stack_00000008 != 3)) {
    *(byte *)(in_RCX + 0x40) = *in_stack_00000008;
    av1_build_intra_predictors_for_interintra
              ((AV1_COMMON *)CONCAT44(uVar1,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff87,in_stack_ffffffffffffff80,
               (BUFFER_SET *)in_stack_ffffffffffffff78,(uint8_t *)in_stack_ffffffffffffff70,
               (int)in_R8);
    av1_combine_interintra
              (in_stack_ffffffffffffff60,bsize_00,in_stack_ffffffffffffff58,
               (uint8_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,in_stack_ffffffffffffff90);
  }
  iVar2 = av1_is_wedge_used(in_DL);
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = *(int *)(tmp_buf_00 + (ulong)in_DL * 4 + 0x2344);
  }
  iVar3 = intrapred_00[*in_stack_00000008] + iVar2;
  iVar4 = iVar3 + (int)*in_R9;
  compute_rd_thresh(in_stack_ffffffffffffff10,total_mode_rate_00,in_stack_ffffffffffffff00);
  iVar5 = estimate_yrd_for_sb(in_stack_ffffffffffffff38,bs,
                              (MACROBLOCK *)CONCAT44(iVar2,in_stack_ffffffffffffff28),
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              (RD_STATS *)
                              CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if (iVar5 == 0x7fffffffffffffff) {
    local_14 = -1;
  }
  else {
    *in_stack_00000010 =
         ((long)(iVar4 + in_stack_ffffffffffffff58) * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9)
         + (long)in_stack_ffffffffffffff60 * 0x80;
    *in_stack_00000018 = iVar3;
    if (((long)in_R8 < 0x7fffffffffffffff) &&
       (lVar6 = (*in_stack_00000010 >> 4) * 9, lVar6 - (long)in_R8 != 0 && (long)in_R8 <= lVar6)) {
      local_14 = -1;
    }
    else {
      local_14 = 0;
    }
  }
  return local_14;
}

Assistant:

static int handle_smooth_inter_intra_mode(
    const AV1_COMP *const cpi, MACROBLOCK *const x, BLOCK_SIZE bsize,
    MB_MODE_INFO *mbmi, int64_t ref_best_rd, int *rate_mv,
    INTERINTRA_MODE *best_interintra_mode, int64_t *best_rd,
    int *best_mode_rate, const BUFFER_SET *orig_dst, uint8_t *tmp_buf,
    uint8_t *intrapred, HandleInterModeArgs *args) {
  MACROBLOCKD *xd = &x->e_mbd;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int *const interintra_mode_cost =
      mode_costs->interintra_mode_cost[size_group_lookup[bsize]];
  const AV1_COMMON *const cm = &cpi->common;
  const int bw = block_size_wide[bsize];

  mbmi->use_wedge_interintra = 0;

  if (cpi->sf.inter_sf.reuse_inter_intra_mode == 0 ||
      *best_interintra_mode == INTERINTRA_MODES) {
    int64_t best_interintra_rd = INT64_MAX;
    for (INTERINTRA_MODE cur_mode = 0; cur_mode < INTERINTRA_MODES;
         ++cur_mode) {
      if ((!cpi->oxcf.intra_mode_cfg.enable_smooth_intra ||
           cpi->sf.intra_sf.disable_smooth_intra) &&
          cur_mode == II_SMOOTH_PRED)
        continue;
      compute_best_interintra_mode(
          cpi, mbmi, xd, x, interintra_mode_cost, orig_dst, intrapred, tmp_buf,
          best_interintra_mode, &best_interintra_rd, cur_mode, bsize);
    }
    args->inter_intra_mode[mbmi->ref_frame[0]] = *best_interintra_mode;
  }
  assert(IMPLIES(!cpi->oxcf.comp_type_cfg.enable_smooth_interintra,
                 *best_interintra_mode != II_SMOOTH_PRED));
  // Recompute prediction if required
  bool interintra_mode_reuse = cpi->sf.inter_sf.reuse_inter_intra_mode ||
                               *best_interintra_mode != INTERINTRA_MODES;
  if (interintra_mode_reuse || *best_interintra_mode != INTERINTRA_MODES - 1) {
    mbmi->interintra_mode = *best_interintra_mode;
    av1_build_intra_predictors_for_interintra(cm, xd, bsize, 0, orig_dst,
                                              intrapred, bw);
    av1_combine_interintra(xd, bsize, 0, tmp_buf, bw, intrapred, bw);
  }

  // Compute rd cost for best smooth_interintra
  RD_STATS rd_stats;
  const int is_wedge_used = av1_is_wedge_used(bsize);
  const int rmode =
      interintra_mode_cost[*best_interintra_mode] +
      (is_wedge_used ? mode_costs->wedge_interintra_cost[bsize][0] : 0);
  const int total_mode_rate = rmode + *rate_mv;
  const int64_t rd_thresh = compute_rd_thresh(x, total_mode_rate, ref_best_rd);
  int64_t rd = estimate_yrd_for_sb(cpi, bsize, x, rd_thresh, &rd_stats);
  if (rd != INT64_MAX) {
    rd = RDCOST(x->rdmult, total_mode_rate + rd_stats.rate, rd_stats.dist);
  } else {
    return IGNORE_MODE;
  }
  *best_rd = rd;
  *best_mode_rate = rmode;
  // Return early if best rd not good enough
  if (ref_best_rd < INT64_MAX &&
      (*best_rd >> INTER_INTRA_RD_THRESH_SHIFT) * INTER_INTRA_RD_THRESH_SCALE >
          ref_best_rd) {
    return IGNORE_MODE;
  }
  return 0;
}